

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# electron_graph.cpp
# Opt level: O2

void __thiscall indigox::ElectronGraph::ElectronGraph(ElectronGraph *this,MolecularGraph *G)

{
  edge_base<boost::undirected_tag,_void_*> *peVar1;
  mapped_type pvVar2;
  mapped_type pvVar3;
  MolEdge e;
  mapped_type *ppvVar4;
  VertType pvVar5;
  MolecularGraph *pMVar6;
  StoredVertexList *pSVar7;
  StoredVertexList *pSVar8;
  element_type *peVar9;
  MolVertex u;
  MolVertex v;
  MolVertProp prop;
  unordered_map<void_*,_void_*,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_void_*>_>_>
  mol2eln;
  undefined1 local_e8 [32];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_c8;
  undefined4 local_c0;
  undefined1 local_bc;
  undefined1 local_bb;
  undefined1 local_ba;
  uint8_t local_b9;
  undefined1 local_b8;
  undefined1 local_b7;
  undefined1 local_b6;
  element_type *local_b0;
  MolVertProp local_a8;
  undefined8 local_88;
  float afStack_80 [2];
  _List_node_base **local_78;
  undefined1 local_68 [40];
  ordered_index<boost::multi_index::member<boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_true>,_void_*,_&boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_true>::left>,_std::less<void_*>,_boost::multi_index::detail::nth_layer<2,_boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<void_*,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>,_boost::mpl::v_item<boost::bimaps::relation::member_at::left,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
  *local_40;
  __node_base_ptr p_Stack_38;
  
  utils::Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>::
  Graph(&this->super__ElnGraph);
  local_68._0_8_ = &p_Stack_38;
  local_68._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  local_68._16_8_ = (_Hash_node_base *)0x0;
  local_68._24_8_ = 0;
  local_68._32_4_ = 1.0;
  local_40 = (ordered_index<boost::multi_index::member<boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_true>,_void_*,_&boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_true>::left>,_std::less<void_*>,_boost::multi_index::detail::nth_layer<2,_boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<void_*,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>,_boost::mpl::v_item<boost::bimaps::relation::member_at::left,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
              *)0x0;
  p_Stack_38 = (__node_base_ptr)0x0;
  pSVar7 = &(((G->super__MolGraph).graph_.
              super___shared_ptr<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::MolVertProp,_indigox::MolEdgeProp,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->super_type).m_vertices;
  pSVar8 = pSVar7;
  local_e8._16_8_ = G;
  while (pSVar8 = *(StoredVertexList **)
                   &(pSVar8->super__List_base<void_*,_std::allocator<void_*>_>)._M_impl._M_node,
        pSVar8 != pSVar7) {
    MolVertProp::MolVertProp
              (&local_a8,
               (MolVertProp *)
               (*(size_t *)
                 ((long)&(pSVar8->super__List_base<void_*,_std::allocator<void_*>_>)._M_impl._M_node
                 + 0x10) + 0x30));
    local_e8._24_8_ =
         *(size_t *)
          ((long)&(pSVar8->super__List_base<void_*,_std::allocator<void_*>_>)._M_impl._M_node + 0x10
          );
    local_c8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._24_8_;
    Atom::GetElement((Atom *)local_e8);
    local_c0 = *(undefined4 *)(local_e8._0_8_ + 0x58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 8));
    Atom::GetElement((Atom *)local_e8);
    local_bc = *(undefined1 *)(local_e8._0_8_ + 0x43);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 8));
    Atom::GetElement((Atom *)local_e8);
    local_bb = *(undefined1 *)(local_e8._0_8_ + 0x42);
    pMVar6 = (MolecularGraph *)(local_e8 + 8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)pMVar6);
    local_ba = 0;
    local_b9 = PreplaceCount(pMVar6,*(MolVertex *)
                                     ((long)&(pSVar8->
                                             super__List_base<void_*,_std::allocator<void_*>_>).
                                             _M_impl._M_node + 0x10));
    Atom::GetElement((Atom *)local_e8);
    local_b8 = *(undefined1 *)(local_e8._0_8_ + 0x44);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 8));
    Atom::GetElement((Atom *)local_e8);
    local_b7 = *(undefined1 *)(local_e8._0_8_ + 0x45);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 8));
    local_b6 = 0;
    local_e8._8_8_ =
         utils::
         Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>::
         AddVertex(&this->super__ElnGraph,(ElnVertProp *)(local_e8 + 0x18));
    local_e8._0_8_ =
         *(size_t *)
          ((long)&(pSVar8->super__List_base<void_*,_std::allocator<void_*>_>)._M_impl._M_node + 0x10
          );
    std::
    _Hashtable<void*,std::pair<void*const,void*>,std::allocator<std::pair<void*const,void*>>,std::__detail::_Select1st,std::equal_to<void*>,std::hash<void*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<void*,void*>>
              ((_Hashtable<void*,std::pair<void*const,void*>,std::allocator<std::pair<void*const,void*>>,std::__detail::_Select1st,std::equal_to<void*>,std::hash<void*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)local_68,(Atom *)local_e8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_a8.atom.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  peVar9 = (((_MolGraph *)local_e8._16_8_)->graph_).
           super___shared_ptr<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::MolVertProp,_indigox::MolEdgeProp,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_e8._16_8_ = peVar9;
  while (peVar9 = *(element_type **)
                   &(peVar9->super_type).m_edges.
                    super__List_base<boost::list_edge<void_*,_indigox::MolEdgeProp>,_std::allocator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>_>
                    ._M_impl, peVar9 != (element_type *)local_e8._16_8_) {
    local_e8._0_8_ =
         *(size_t *)
          ((long)&(peVar9->super_type).m_edges.
                  super__List_base<boost::list_edge<void_*,_indigox::MolEdgeProp>,_std::allocator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>_>
          + 0x10);
    local_b0 = *(element_type **)
                &(peVar9->super_type).m_vertices.super__List_base<void_*,_std::allocator<void_*>_>.
                 _M_impl;
    pMVar6 = (MolecularGraph *)local_68;
    ppvVar4 = std::__detail::
              _Map_base<void_*,_std::pair<void_*const,_void_*>,_std::allocator<std::pair<void_*const,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::at((_Map_base<void_*,_std::pair<void_*const,_void_*>,_std::allocator<std::pair<void_*const,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)pMVar6,(key_type *)local_e8);
    pvVar2 = *ppvVar4;
    ppvVar4 = std::__detail::
              _Map_base<void_*,_std::pair<void_*const,_void_*>,_std::allocator<std::pair<void_*const,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::at((_Map_base<void_*,_std::pair<void_*const,_void_*>,_std::allocator<std::pair<void_*const,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)pMVar6,&local_b0);
    local_c8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._0_8_;
    local_e8._24_8_ = local_b0;
    if ((ulong)local_e8._0_8_ < local_b0) {
      local_c8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0;
      local_e8._24_8_ = local_e8._0_8_;
    }
    pvVar3 = *ppvVar4;
    local_ba = 0;
    local_78 = (_List_node_base **)
               ((long)&(peVar9->super_type).m_vertices.
                       super__List_base<void_*,_std::allocator<void_*>_> + 8);
    peVar1 = (edge_base<boost::undirected_tag,_void_*> *)
             ((long)&(peVar9->super_type).m_edges.
                     super__List_base<boost::list_edge<void_*,_indigox::MolEdgeProp>,_std::allocator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>_>
             + 0x10);
    local_88 = peVar1->m_source;
    afStack_80 = *(float (*) [2])
                  &(peVar9->super_type).m_vertices.super__List_base<void_*,_std::allocator<void_*>_>
                   ._M_impl;
    e.m_eproperty = local_78;
    e.super_edge_base<boost::undirected_tag,_void_*> = *peVar1;
    local_b9 = PreplaceCount(pMVar6,e);
    pvVar5 = utils::
             Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
             ::AddVertex(&this->super__ElnGraph,(ElnVertProp *)(local_e8 + 0x18));
    utils::Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
    ::AddEdge(&local_a8,&this->super__ElnGraph,pvVar2,pvVar5);
    utils::Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
    ::AddEdge(&local_a8,&this->super__ElnGraph,pvVar3,pvVar5);
  }
  std::
  _Hashtable<void_*,_std::pair<void_*const,_void_*>,_std::allocator<std::pair<void_*const,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<void_*,_std::pair<void_*const,_void_*>,_std::allocator<std::pair<void_*const,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_68);
  return;
}

Assistant:

ElectronGraph::ElectronGraph(const MolecularGraph &G)
  : _ElnGraph()
  {
    using namespace std;
    unordered_map<MolVertex, ElnVertex> mol2eln;
    MolVertIterPair vertices = G.GetVertices();
    uint16_t count = 0;
    for (MolVertexIter b = vertices.first; b != vertices.second; ++b) {
      MolVertProp prop = *G.GetProperties(*b);
      ElnVertProp e_prop;
      e_prop.id = make_pair(*b, *b);
      count++;
      e_prop.electronegativity = prop.atom->GetElement()->GetElectronegativity();
      e_prop.valence = prop.atom->GetElement()->GetValenceElectronCount();
      e_prop.atomic_number = prop.atom->GetElement()->GetAtomicNumber();
      e_prop.electron_count = 0;
      e_prop.pre_placed = PreplaceCount(G, *b);
      e_prop.target_octet = prop.atom->GetElement()->GetOctet();
      e_prop.target_hyper_octet = prop.atom->GetElement()->GetHypervalentOctet();
      e_prop.formal_charge = 0;
      
      
      ElnVertex e_vert = AddVertex(e_prop);
      mol2eln.insert(make_pair(*b, e_vert));
    }
    
    MolEdgeIterPair edges = G.GetEdges();
    for (MolEdgeIter b = edges.first; b != edges.second; ++b) {
      MolVertex u = G.GetSource(*b), v = G.GetTarget(*b);
      ElnVertex u_eln = mol2eln.at(u), v_eln = mol2eln.at(v);
      ElnVertProp e_prop;
      if (u < v)
        e_prop.id = make_pair(u, v);
      else
        e_prop.id = make_pair(v, u);
      e_prop.electron_count = 0;
      e_prop.pre_placed = PreplaceCount(G, *b);
      ElnVertex e_vert = AddVertex(e_prop);
      AddEdge(u_eln, e_vert);
      AddEdge(v_eln, e_vert);
    }
  }